

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

void set_node_pos(c2m_ctx_t c2m_ctx,node_t_conflict n,pos_t pos)

{
  int *piVar1;
  uint uVar2;
  VARR_pos_t *pVVar3;
  size_t sVar4;
  ulong *puVar5;
  long lVar6;
  long lVar7;
  code *pcVar8;
  int iVar9;
  undefined1 *puVar10;
  pos_t *ppVar11;
  void *pvVar12;
  pos_t *ppVar13;
  int extraout_EDX;
  uint uVar14;
  pos_t *unaff_RBX;
  long lVar15;
  uint *puVar16;
  uint *puVar17;
  uint uVar18;
  node_t_conflict __size;
  uint uVar19;
  c2m_ctx_t htab;
  ulong uVar20;
  long lVar21;
  undefined4 *puVar22;
  uint uVar23;
  char *unaff_R14;
  undefined8 *puVar24;
  uint *puVar25;
  
  ppVar13 = pos._8_8_;
  pVVar3 = c2m_ctx->node_positions;
  htab = c2m_ctx;
  __size = n;
  ppVar11 = ppVar13;
  while (pVVar3 != (VARR_pos_t *)0x0) {
    ppVar11 = (pos_t *)(ulong)n->uid;
    unaff_RBX = ppVar13;
    unaff_R14 = pos.fname;
    if (ppVar11 < (pos_t *)pVVar3->els_num) goto LAB_0017cbe7;
    htab = (c2m_ctx_t)pVVar3->varr;
    if (htab == (c2m_ctx_t)0x0) {
      set_node_pos_cold_1();
      goto LAB_0017cc11;
    }
    puVar10 = (undefined1 *)((long)&((pos_t *)pVVar3->els_num)->fname + 1);
    if ((undefined1 *)pVVar3->size < puVar10) {
      __size = (node_t_conflict)((long)(puVar10 + ((ulong)puVar10 >> 1)) * 0x10);
      ppVar11 = (pos_t *)realloc(htab,(size_t)__size);
      pVVar3->varr = ppVar11;
      pVVar3->size = (size_t)(puVar10 + ((ulong)puVar10 >> 1));
    }
    sVar4 = pVVar3->els_num;
    ppVar11 = pVVar3->varr;
    pVVar3->els_num = sVar4 + 1;
    ppVar11[sVar4].fname = (char *)0x0;
    ppVar11[sVar4].lno = -1;
    ppVar11[sVar4].ln_pos = -1;
    pVVar3 = c2m_ctx->node_positions;
  }
  set_node_pos_cold_3();
LAB_0017cbe7:
  ppVar13 = pVVar3->varr;
  if (ppVar13 != (pos_t *)0x0) {
    ppVar13[(long)ppVar11].fname = unaff_R14;
    *(pos_t **)&ppVar13[(long)ppVar11].lno = unaff_RBX;
    return;
  }
LAB_0017cc11:
  set_node_pos_cold_2();
  puVar5 = (ulong *)htab->env[0].__jmpbuf[5];
  if (puVar5 == (ulong *)0x0) {
    HTAB_macro_t_do_cold_8();
LAB_0017cf47:
    HTAB_macro_t_do_cold_7();
LAB_0017cf4c:
    HTAB_macro_t_do_cold_2();
LAB_0017cf51:
    HTAB_macro_t_do_cold_1();
LAB_0017cf56:
    HTAB_macro_t_do_cold_4();
LAB_0017cf5b:
    HTAB_macro_t_do_cold_6();
  }
  else {
    puVar24 = (undefined8 *)htab->env[0].__jmpbuf[4];
    if (puVar24 == (undefined8 *)0x0) goto LAB_0017cf47;
    lVar6 = htab->env[0].__jmpbuf[0];
    uVar19 = (uint)*puVar5;
    uVar14 = uVar19;
    if ((1 < extraout_EDX - 1U) || (iVar9 = (int)*puVar24, *(int *)&htab->options != iVar9)) {
LAB_0017cda7:
      iVar9 = (*(code *)htab->env[0].__jmpbuf[1])(__size,lVar6);
      uVar19 = iVar9 + (uint)(iVar9 == 0);
      lVar7 = htab->env[0].__jmpbuf[5];
      if (lVar7 == 0) goto LAB_0017cf4c;
      lVar15 = htab->env[0].__jmpbuf[4];
      if (lVar15 != 0) {
        lVar7 = *(long *)(lVar7 + 0x10);
        lVar15 = *(long *)(lVar15 + 0x10);
        puVar16 = (uint *)0x0;
        uVar23 = uVar19;
        uVar18 = uVar19;
        do {
          uVar18 = uVar18 & uVar14 - 1;
          puVar25 = (uint *)(lVar7 + (ulong)uVar18 * 4);
          uVar2 = *puVar25;
          puVar17 = puVar25;
          if ((ulong)uVar2 != 0xfffffffe) {
            if (uVar2 == 0xffffffff) {
              if (1 < extraout_EDX - 1U) {
                return;
              }
              *(int *)&htab->ctx = *(int *)&htab->ctx + 1;
              if (puVar16 != (uint *)0x0) {
                puVar25 = puVar16;
              }
              uVar14 = *(uint *)&htab->options;
              *(uint *)(lVar15 + (ulong)uVar14 * 0x10) = uVar19;
              *(node_t_conflict *)(lVar15 + 8 + (ulong)uVar14 * 0x10) = __size;
              *(uint *)&htab->options = uVar14 + 1;
              *puVar25 = uVar14;
              ppVar11->fname = (char *)__size;
              return;
            }
            lVar21 = (ulong)uVar2 * 0x10;
            puVar17 = puVar16;
            if (*(uint *)(lVar15 + lVar21) == uVar19) {
              puVar22 = (undefined4 *)(lVar21 + lVar15);
              iVar9 = (*(code *)htab->env[0].__jmpbuf[2])(*(undefined8 *)(puVar22 + 2),__size,lVar6)
              ;
              if (iVar9 != 0) {
                if (extraout_EDX == 3) {
                  *(int *)&htab->ctx = *(int *)&htab->ctx + -1;
                  *puVar25 = 0xfffffffe;
                  pcVar8 = (code *)htab->env[0].__jmpbuf[3];
                  if (pcVar8 != (code *)0x0) {
                    (*pcVar8)(*(undefined8 *)(puVar22 + 2),lVar6);
                  }
                  *puVar22 = 0;
                }
                else {
                  if (extraout_EDX == 2) {
                    pcVar8 = (code *)htab->env[0].__jmpbuf[3];
                    if (pcVar8 != (code *)0x0) {
                      (*pcVar8)(*(undefined8 *)(puVar22 + 2),lVar6);
                    }
                    *(node_t_conflict *)(puVar22 + 2) = __size;
                  }
                  ppVar11->fname = (char *)*(macro_t *)(puVar22 + 2);
                }
                return;
              }
            }
          }
          uVar23 = uVar23 >> 0xb;
          uVar18 = uVar23 + 1 + uVar18 * 5;
          piVar1 = (int *)((long)&htab->options + 4);
          *piVar1 = *piVar1 + 1;
          puVar16 = puVar17;
        } while( true );
      }
      goto LAB_0017cf51;
    }
    if ((void *)puVar5[2] == (void *)0x0) goto LAB_0017cf5b;
    uVar14 = uVar19 * 2;
    uVar20 = (ulong)uVar14;
    if (puVar5[1] != uVar20) {
      pvVar12 = realloc((void *)puVar5[2],uVar20 * 4);
      puVar5[2] = (ulong)pvVar12;
    }
    puVar5[1] = uVar20;
    *puVar5 = uVar20;
    lVar7 = htab->env[0].__jmpbuf[5];
    if (lVar7 != 0) {
      if (uVar14 != 0) {
        memset(*(void **)(lVar7 + 0x10),0xff,(ulong)(uVar19 & 0x7fffffff) << 3);
      }
      puVar5 = (ulong *)htab->env[0].__jmpbuf[4];
      if ((puVar5 != (ulong *)0x0) && ((void *)puVar5[2] != (void *)0x0)) {
        uVar20 = (ulong)(uint)(iVar9 * 2);
        if (puVar5[1] != uVar20) {
          pvVar12 = realloc((void *)puVar5[2],uVar20 << 4);
          puVar5[2] = (ulong)pvVar12;
        }
        puVar5[1] = uVar20;
        *puVar5 = uVar20;
        lVar7 = htab->env[0].__jmpbuf[4];
        if (lVar7 == 0) goto LAB_0017cf65;
        lVar7 = *(long *)(lVar7 + 0x10);
        uVar19 = *(uint *)((long)&htab->ctx + 4);
        uVar18 = *(uint *)&htab->options;
        *(undefined4 *)&htab->ctx = 0;
        *(undefined4 *)&htab->options = 0;
        *(undefined4 *)((long)&htab->ctx + 4) = 0;
        if (uVar19 < uVar18) {
          lVar15 = (ulong)uVar18 - (ulong)uVar19;
          puVar24 = (undefined8 *)((ulong)uVar19 * 0x10 + 8 + lVar7);
          do {
            if (*(int *)(puVar24 + -1) != 0) {
              HTAB_macro_t_do((HTAB_macro_t *)htab,(macro_t)*puVar24,HTAB_INSERT,(macro_t *)ppVar11)
              ;
              (*(code *)htab->env[0].__jmpbuf[2])((macro_t)ppVar11->fname,*puVar24,lVar6);
            }
            puVar24 = puVar24 + 2;
            lVar15 = lVar15 + -1;
          } while (lVar15 != 0);
        }
        goto LAB_0017cda7;
      }
      goto LAB_0017cf56;
    }
  }
  HTAB_macro_t_do_cold_5();
LAB_0017cf65:
  HTAB_macro_t_do_cold_3();
  return;
}

Assistant:

static void set_node_pos (c2m_ctx_t c2m_ctx, node_t n, pos_t pos) {
  while (n->uid >= VARR_LENGTH (pos_t, node_positions)) VARR_PUSH (pos_t, node_positions, no_pos);
  VARR_SET (pos_t, node_positions, n->uid, pos);
}